

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfRelocator.cpp
# Opt level: O0

vector<ArFileEntry,_std::allocator<ArFileEntry>_> *
loadArArchive(vector<ArFileEntry,_std::allocator<ArFileEntry>_> *__return_storage_ptr__,
             path *inputName)

{
  size_t sVar1;
  long *plVar2;
  int *piVar3;
  ArFileHeader *pAVar4;
  byte *pbVar5;
  ByteArray local_150;
  undefined1 local_138 [8];
  ArFileEntry entry_1;
  byte local_f8 [4];
  int i_1;
  char fileName [17];
  int local_d8;
  int local_d4;
  int i;
  int size;
  ArFileHeader *header;
  size_t pos;
  string local_a0;
  undefined1 local_80 [8];
  ArFileEntry entry;
  undefined1 local_30 [8];
  ByteArray input;
  path *inputName_local;
  vector<ArFileEntry,_std::allocator<ArFileEntry>_> *result;
  
  input.allocatedSize_ = (size_t)inputName;
  ByteArray::fromFile((ByteArray *)local_30,inputName,0,0);
  std::vector<ArFileEntry,_std::allocator<ArFileEntry>_>::vector(__return_storage_ptr__);
  sVar1 = ByteArray::size((ByteArray *)local_30);
  if ((sVar1 < 8) ||
     (plVar2 = (long *)ByteArray::data((ByteArray *)local_30,0), *plVar2 != 0xa3e686372613c21)) {
    sVar1 = ByteArray::size((ByteArray *)local_30);
    if ((sVar1 < 4) ||
       (piVar3 = (int *)ByteArray::data((ByteArray *)local_30,0), *piVar3 != 0x464c457f)) {
      entry.data.allocatedSize_._0_4_ = 1;
    }
    else {
      ArFileEntry::ArFileEntry((ArFileEntry *)local_80);
      ghc::filesystem::path::filename((path *)&pos,(path *)input.allocatedSize_);
      ghc::filesystem::path::u8string_abi_cxx11_(&local_a0,(path *)&pos);
      std::__cxx11::string::operator=((string *)local_80,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      ghc::filesystem::path::~path((path *)&pos);
      ByteArray::operator=((ByteArray *)((long)&entry.name.field_2 + 8),(ByteArray *)local_30);
      std::vector<ArFileEntry,_std::allocator<ArFileEntry>_>::push_back
                (__return_storage_ptr__,(value_type *)local_80);
      entry.data.allocatedSize_._0_4_ = 1;
      ArFileEntry::~ArFileEntry((ArFileEntry *)local_80);
    }
  }
  else {
    header = (ArFileHeader *)0x8;
    while (pAVar4 = (ArFileHeader *)ByteArray::size((ByteArray *)local_30), header < pAVar4) {
      pbVar5 = ByteArray::data((ByteArray *)local_30,(size_t)header);
      pAVar4 = header + 1;
      local_d4 = 0;
      local_d8 = 0;
      while ((local_d8 < 10 && (pbVar5[(long)local_d8 + 0x30] != ' '))) {
        local_d4 = (char)pbVar5[(long)local_d8 + 0x30] + -0x30 + local_d4 * 10;
        local_d8 = local_d8 + 1;
      }
      piVar3 = (int *)ByteArray::data((ByteArray *)local_30,(size_t)pAVar4);
      if (*piVar3 == 0x464c457f) {
        fileName[8] = '\0';
        for (entry_1.data.allocatedSize_._4_4_ = 0; entry_1.data.allocatedSize_._4_4_ < 0x10;
            entry_1.data.allocatedSize_._4_4_ = entry_1.data.allocatedSize_._4_4_ + 1) {
          if (pbVar5[entry_1.data.allocatedSize_._4_4_] == ' ') {
            if ((0 < entry_1.data.allocatedSize_._4_4_) &&
               (local_f8[entry_1.data.allocatedSize_._4_4_ + -1] == '/')) {
              entry_1.data.allocatedSize_._4_4_ = entry_1.data.allocatedSize_._4_4_ + -1;
            }
            local_f8[entry_1.data.allocatedSize_._4_4_] = '\0';
            break;
          }
          local_f8[entry_1.data.allocatedSize_._4_4_] = pbVar5[entry_1.data.allocatedSize_._4_4_];
        }
        ArFileEntry::ArFileEntry((ArFileEntry *)local_138);
        std::__cxx11::string::operator=((string *)local_138,(char *)local_f8);
        ByteArray::mid(&local_150,(ByteArray *)local_30,(size_t)pAVar4,(long)local_d4);
        ByteArray::operator=((ByteArray *)((long)&entry_1.name.field_2 + 8),&local_150);
        ByteArray::~ByteArray(&local_150);
        std::vector<ArFileEntry,_std::allocator<ArFileEntry>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_138);
        ArFileEntry::~ArFileEntry((ArFileEntry *)local_138);
      }
      header = (ArFileHeader *)(pAVar4->fileName + local_d4);
      if (((ulong)header & 1) != 0) {
        header = (ArFileHeader *)(header->fileName + 1);
      }
    }
    entry.data.allocatedSize_._0_4_ = 1;
  }
  ByteArray::~ByteArray((ByteArray *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ArFileEntry> loadArArchive(const fs::path& inputName)
{
	ByteArray input = ByteArray::fromFile(inputName);
	std::vector<ArFileEntry> result;

	if (input.size() < 8 || memcmp(input.data(),"!<arch>\n",8) != 0)
	{
		if (input.size() < 4 || memcmp(input.data(),"\x7F""ELF",4) != 0)
			return result;

		ArFileEntry entry;
		entry.name = inputName.filename().u8string();
		entry.data = input;
		result.push_back(entry);
		return result;
	}

	size_t pos = 8;
	while (pos < input.size())
	{
		ArFileHeader* header = (ArFileHeader*) input.data(pos);
		pos += sizeof(ArFileHeader);
		
		// get file size
		int size = 0;
		for (int i = 0; i < 10; i++)
		{
			if (header->fileSize[i] == ' ')
				break;

			size = size*10;
			size += (header->fileSize[i]-'0');
		}

		// only ELF files are actually interesting
		if (memcmp(input.data(pos),"\x7F""ELF",4) == 0)
		{
			// get file name
			char fileName[17];
			fileName[16] = 0;
			for (int i = 0; i < 16; i++)
			{
				if (header->fileName[i] == ' ')
				{
					// remove trailing slashes of file names
					if (i > 0 && fileName[i-1] == '/')
						i--;
					fileName[i] = 0;
					break;
				}

				fileName[i] = header->fileName[i];
			}
		
			ArFileEntry entry;
			entry.name = fileName;
			entry.data = input.mid(pos,size);
			result.push_back(entry);
		}

		pos += size;
		if (pos % 2)
			pos++;
	}

	return result;
}